

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::InternalException::InternalException<long,unsigned_short,unsigned_short>
          (InternalException *this,string *msg,long params,unsigned_short params_1,
          unsigned_short params_2)

{
  undefined6 in_register_0000000a;
  unsigned_short in_R9W;
  string local_30;
  
  Exception::ConstructMessage<long,unsigned_short,unsigned_short>
            (&local_30,(Exception *)msg,(string *)params,CONCAT62(in_register_0000000a,params_1),
             params_2,in_R9W);
  InternalException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}